

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall CP::queue<int>::push(queue<int> *this,int *element)

{
  int *element_local;
  queue<int> *this_local;
  
  ensureCapacity(this,this->mSize + 1);
  this->mData[(this->mFront + this->mSize) % this->mCap] = *element;
  this->mSize = this->mSize + 1;
  return;
}

Assistant:

void push(const T& element) {
      ensureCapacity(mSize+1);
      mData[(mFront + mSize) % mCap] = element;
      mSize++;
    }